

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Class::findShadowMembers_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Class *this,Class *_class1)

{
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *puVar2;
  mapped_type *ppVVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
  *puVar4;
  reference __x;
  mapped_type *this_00;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string shadowMessage_1;
  Function **f2;
  const_iterator __end4;
  const_iterator __begin4;
  mapped_type *__range4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
  local_158;
  reference local_150;
  Function **f1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Function_*,_std::allocator<Function_*>_> *__range2;
  value_type *c1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string shadowMessage;
  mapped_type v2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
  local_50;
  reference local_48;
  value_type *v1;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *__range1;
  Class *_class1_local;
  Class *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *shadowMessages;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  puVar2 = getVariables_abi_cxx11_(_class1);
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
           ::begin(puVar2);
  v1 = (value_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       ::end(puVar2);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
                              *)&v1), bVar1) {
    local_48 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_false,_true>
               ::operator*(&__end1);
    puVar2 = getVariables_abi_cxx11_(this);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
         ::find(puVar2,&local_48->first);
    puVar2 = getVariables_abi_cxx11_(this);
    v2 = (mapped_type)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
         ::end(puVar2);
    bVar1 = std::__detail::operator!=
                      (&local_50,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
                        *)&v2);
    if (bVar1) {
      puVar2 = getVariables_abi_cxx11_(this);
      ppVVar3 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
                ::at(puVar2,&local_48->first);
      shadowMessage.field_2._8_8_ = *ppVVar3;
      bVar1 = ::operator==(local_48->second,(Variable *)shadowMessage.field_2._8_8_);
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1_1,"Shadow variable ",&local_48->first);
        std::operator+(&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1_1," between ");
        psVar5 = getName_abi_cxx11_(_class1);
        std::operator+(&local_d0,&local_f0,psVar5);
        std::operator+(&local_b0,&local_d0," and ");
        psVar5 = getName_abi_cxx11_(this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,&local_b0,psVar5);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&__range1_1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_90);
        std::__cxx11::string::~string((string *)local_90);
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_false,_true>
    ::operator++(&__end1);
  }
  puVar4 = getFunctions_abi_cxx11_(_class1);
  __end1_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
             ::begin(puVar4);
  c1 = (value_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
       ::end(puVar4);
  while (bVar1 = std::__detail::operator!=
                           (&__end1_1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
                              *)&c1), bVar1) {
    __x = std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_false,_true>
          ::operator*(&__end1_1);
    __end2 = std::vector<Function_*,_std::allocator<Function_*>_>::begin(&__x->second);
    f1 = (Function **)std::vector<Function_*,_std::allocator<Function_*>_>::end(&__x->second);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>
                                       *)&f1), bVar1) {
      local_150 = __gnu_cxx::
                  __normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>
                  ::operator*(&__end2);
      puVar4 = getFunctions_abi_cxx11_(this);
      local_158._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
           ::find(puVar4,&__x->first);
      puVar4 = getFunctions_abi_cxx11_(this);
      __range4 = (mapped_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
                 ::end(puVar4);
      bVar1 = std::__detail::operator!=
                        (&local_158,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
                          *)&__range4);
      if (bVar1) {
        puVar4 = getFunctions_abi_cxx11_(this);
        this_00 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
                  ::at(puVar4,&__x->first);
        __end4 = std::vector<Function_*,_std::allocator<Function_*>_>::begin(this_00);
        f2 = (Function **)std::vector<Function_*,_std::allocator<Function_*>_>::end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>
                                           *)&f2), bVar1) {
          shadowMessage_1.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>
               ::operator*(&__end4);
          bVar1 = ::operator==(*local_150,*(Function **)shadowMessage_1.field_2._8_8_);
          if (bVar1) {
            psVar5 = Function::getName_abi_cxx11_(*local_150);
            std::operator+(&local_220,"Shadow function ",psVar5);
            std::operator+(&local_200,&local_220," between ");
            psVar5 = getName_abi_cxx11_(_class1);
            std::operator+(&local_1e0,&local_200,psVar5);
            std::operator+(&local_1c0,&local_1e0," and ");
            psVar5 = getName_abi_cxx11_(this);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,&local_1c0,psVar5);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::string::~string((string *)&local_200);
            std::__cxx11::string::~string((string *)&local_220);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,(value_type *)local_1a0);
            std::__cxx11::string::~string((string *)local_1a0);
          }
          __gnu_cxx::
          __normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>
          ::operator++(&__end4);
        }
      }
      __gnu_cxx::
      __normal_iterator<Function_*const_*,_std::vector<Function_*,_std::allocator<Function_*>_>_>::
      operator++(&__end2);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_false,_true>
    ::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Class::findShadowMembers(Class &_class1) {
    std::vector<std::string> shadowMessages;
    for (const auto &v1: _class1.getVariables()) {
        if (getVariables().find(v1.first) != getVariables().end()) {
            auto v2 = getVariables().at(v1.first);
            if (*v1.second == *v2) {
                std::string shadowMessage =
                        "Shadow variable " + v1.first + " between " + _class1.getName() + " and " + getName();
                shadowMessages.push_back(shadowMessage);
            }
        }
    }

    for (const auto &c1: _class1.getFunctions()) {
        for (const auto &f1 : c1.second) {
            if (getFunctions().find(c1.first) != getFunctions().end()) {
                for (const auto &f2 : getFunctions().at(c1.first)) {
                    if (*f1 == *f2) {
                        std::string shadowMessage =
                                "Shadow function " + f1->getName() + " between " + _class1.getName() + " and " +
                                getName();
                        shadowMessages.push_back(shadowMessage);
                    }
                }
            }
        }
    }

    return shadowMessages;
}